

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

Instruction * Instruction::get(Addr addr,int size)

{
  Addr AVar1;
  mapped_type *ppIVar2;
  mapped_type pIVar3;
  Addr local_48;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_48 = addr;
  ppIVar2 = std::
            map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
            ::operator[](&m_instrsMap,&local_48);
  pIVar3 = *ppIVar2;
  if (pIVar3 == (mapped_type)0x0) {
    pIVar3 = (mapped_type)operator_new(0x38);
    AVar1 = local_48;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"???","");
    pIVar3->_vptr_Instruction = (_func_int **)&PTR__Instruction_0012a7f0;
    pIVar3->m_addr = AVar1;
    pIVar3->m_size = size;
    (pIVar3->m_text)._M_dataplus._M_p = (pointer)&(pIVar3->m_text).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pIVar3->m_text,local_40,local_40 + local_38);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    ppIVar2 = std::
              map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
              ::operator[](&m_instrsMap,&local_48);
    *ppIVar2 = pIVar3;
  }
  else if (pIVar3->m_size == 0) {
    pIVar3->m_size = size;
  }
  else if ((size != 0) && (pIVar3->m_size != size)) {
    __assert_fail("instr->m_size == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/Instruction.cpp"
                  ,0x2c,"static Instruction *Instruction::get(Addr, int)");
  }
  return pIVar3;
}

Assistant:

Instruction* Instruction::get(Addr addr, int size) {
	Instruction* instr = m_instrsMap[addr];
	if (instr) {
		if (instr->m_size == 0)
			instr->m_size = size;
		else if (size != 0)
			assert(instr->m_size == size);
	} else {
		instr = new Instruction(addr, size);
		m_instrsMap[addr] = instr;
	}

	return instr;
}